

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O2

bool __thiscall
banksia::TourMng::pairingMatchList
          (TourMng *this,
          vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *playerVec,int round)

{
  pointer pMVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  TourMng *this_00;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  reference pvVar8;
  ostream *poVar9;
  undefined4 in_register_00000014;
  size_type __n;
  int iVar10;
  difference_type __d;
  pointer pTVar11;
  int i;
  pointer pTVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pTVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined8 local_1b0;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  TourMng *local_168;
  string local_160;
  string str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pairedSet;
  
  local_1b0 = CONCAT44(in_register_00000014,round);
  pTVar13 = (playerVec->
            super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pTVar12 = (playerVec->
            super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar7 = ((long)pTVar12 - (long)pTVar13) / 0x50;
  if (uVar7 < 2) {
    if ((long)pTVar12 - (long)pTVar13 == 0x50) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pairedSet
                     ,"\n* The winner is ",&pTVar13->name);
      matchLog(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pairedSet,
               true);
      std::__cxx11::string::~string((string *)&pairedSet);
    }
    return false;
  }
  if ((uVar7 & 1) != 0) {
    iVar10 = 0xb;
    do {
      iVar10 = iVar10 + -1;
      if (iVar10 == 0) goto LAB_0014caed;
      iVar6 = rand();
      auVar3._8_8_ = 0;
      auVar3._0_8_ = ((long)(playerVec->
                            super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(playerVec->
                           super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x50;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)iVar6;
      __n = SUB168(auVar4 % auVar3,0);
      pvVar8 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                         (playerVec,__n);
    } while (pvVar8->byeCnt != 0);
    if (SUB164(auVar4 % auVar3,0) < 0) {
LAB_0014caed:
      for (__n = 0; __n < (ulong)(((long)(playerVec->
                                         super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(playerVec->
                                        super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                                        )._M_impl.super__Vector_impl_data._M_start) / 0x50);
          __n = __n + 1) {
        pvVar8 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                           (playerVec,__n);
        if (pvVar8->byeCnt == 0) goto LAB_0014cb54;
      }
      iVar10 = rand();
      __n = (ulong)(long)iVar10 %
            (ulong)(((long)(playerVec->
                           super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(playerVec->
                          super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x50);
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "Warning: all players have been bye (odd players who got free wins)."
                              );
      std::endl<char,std::char_traits<char>>(poVar9);
    }
LAB_0014cb54:
    pvVar8 = std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::at
                       (playerVec,(long)(int)__n);
    TourPlayer::TourPlayer((TourPlayer *)&str,pvVar8);
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::erase
              (playerVec,
               (playerVec->
               super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
               _M_impl.super__Vector_impl_data._M_start + (int)__n);
    std::__cxx11::string::string((string *)&str_2,"",(allocator *)&local_1d0);
    MatchRecord::MatchRecord((MatchRecord *)&pairedSet,(string *)&str._M_string_length,&str_2,false)
    ;
    std::__cxx11::string::~string((string *)&str_2);
    pairedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
    rand();
    addMatchRecord_simple(this,(MatchRecord *)&pairedSet);
    std::operator+(&local_188,"\n* Player ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &str._M_string_length);
    std::operator+(&local_1d0,&local_188,
                   " is an odd one (no opponent to pair with) and receives a bye (a win) for round "
                  );
    std::__cxx11::to_string(&local_1a8,round + 1);
    std::operator+(&str_2,&local_1d0,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_188);
    matchLog(this,&str_2,(bool)banksiaVerbose);
    std::__cxx11::string::~string((string *)&str_2);
    MatchRecord::~MatchRecord((MatchRecord *)&pairedSet);
    TourPlayer::~TourPlayer((TourPlayer *)&str);
    pTVar13 = (playerVec->
              super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl
              .super__Vector_impl_data._M_start;
    pTVar12 = (playerVec->
              super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl
              .super__Vector_impl_data._M_finish;
  }
  if (pTVar13 != pTVar12) {
    uVar7 = ((long)pTVar12 - (long)pTVar13) / 0x50;
    lVar2 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
              (pTVar13,pTVar12,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar12 - (long)pTVar13 < 0x501) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                (pTVar13,pTVar12);
    }
    else {
      pTVar11 = pTVar13 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                (pTVar13,pTVar11);
      for (; pTVar11 != pTVar12; pTVar11 = pTVar11 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Val_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                  (pTVar11);
      }
    }
  }
  pairedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pairedSet._M_t._M_impl.super__Rb_tree_header._M_header;
  pairedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pairedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pairedSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar1 = (this->matchRecordList).
           super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_168 = this;
  pairedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pairedSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__rhs = ((this->matchRecordList).
                super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>.
                _M_impl.super__Vector_impl_data._M_start)->playernames + 1; this_00 = local_168,
      (pointer)&__rhs[-2].field_2 != pMVar1; __rhs = __rhs + 6) {
    if ((__rhs[-1]._M_string_length != 0) && (__rhs->_M_string_length != 0)) {
      std::operator+(&str_2,__rhs + -1,"*");
      std::operator+(&str,&str_2,__rhs);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&pairedSet,&str);
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&str_2);
    }
  }
  iVar10 = (int)local_1b0;
  bVar5 = pairingMatchListRecusive(local_168,playerVec,iVar10,&pairedSet);
  if (!bVar5) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "Warning: All players have played together already.");
    std::endl<char,std::char_traits<char>>(poVar9);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pairedSet._M_t);
    bVar5 = pairingMatchListRecusive
                      (this_00,playerVec,iVar10,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&pairedSet._M_t);
    if (!bVar5) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Error: cannot pair players.");
      std::endl<char,std::char_traits<char>>(poVar9);
      bVar5 = false;
      goto LAB_0014d01d;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_188,tourTypeNames[(int)this_00->type],(allocator *)&local_160);
  std::operator+(&local_1d0,"\n",&local_188);
  std::operator+(&str_2,&local_1d0," round: ");
  std::__cxx11::to_string(&local_1a8,iVar10 + 1);
  std::operator+(&str,&str_2,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&str_2);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_188);
  if (this_00->type == swiss) {
    std::__cxx11::to_string(&local_1d0,this_00->swissRounds);
    std::operator+(&str_2,"/",&local_1d0);
    std::__cxx11::string::append((string *)&str);
    std::__cxx11::string::~string((string *)&str_2);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::__cxx11::to_string
            (&local_1a8,
             (ulong)(((long)(playerVec->
                            super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(playerVec->
                           super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x50) >> 1);
  std::operator+(&local_188,", pairs: ",&local_1a8);
  std::operator+(&local_1d0,&local_188,", matches: ");
  iVar10 = uncompletedMatches(this_00);
  std::__cxx11::to_string(&local_160,iVar10);
  std::operator+(&str_2,&local_1d0,&local_160);
  std::__cxx11::string::append((string *)&str);
  std::__cxx11::string::~string((string *)&str_2);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  matchLog(this_00,&str,true);
  std::__cxx11::string::~string((string *)&str);
  bVar5 = true;
LAB_0014d01d:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&pairedSet._M_t);
  return bVar5;
}

Assistant:

bool TourMng::pairingMatchList(std::vector<TourPlayer> playerVec, int round)
{
    if (playerVec.size() < 2) {
        if (playerVec.size() == 1) {
            auto str = "\n* The winner is " + playerVec.front().name;
            matchLog(str, true);
        }
        return false;
    }
    
    // odd/bye players, one won't have opponent and he is lucky to set win
    if (playerVec.size() & 1) {
        auto luckyIdx = -1;
        for (int i = 0; i < 10; i++) {
            auto k = std::rand() % playerVec.size();
            if (playerVec.at(k).byeCnt == 0) {
                luckyIdx = int(k);
                break;
            }
        }
        
        if (luckyIdx < 0) {
            for (int i = 0; i <  playerVec.size(); i++) {
                if (playerVec.at(i).byeCnt == 0) {
                    luckyIdx = i;
                    break;
                }
            }
        }
        
        if (luckyIdx < 0) {
            luckyIdx = std::rand() % playerVec.size();
            std::cerr << "Warning: all players have been bye (odd players who got free wins)." << std::endl;
        }
        
        auto luckPlayer = playerVec.at(luckyIdx);
        
        {
            auto it = playerVec.begin();
            std::advance(it, luckyIdx);
            playerVec.erase(it);
        }
        
        
        // the odd player wins all games in the round
        MatchRecord record(luckPlayer.name, "", false);
        record.round = round;
        record.state = MatchState::completed;
        record.result.result = ResultType::win; // win
        record.pairId = std::rand();
        addMatchRecord_simple(record);
        
        auto str = "\n* Player " + luckPlayer.name + " is an odd one (no opponent to pair with) and receives a bye (a win) for round " + std::to_string(round + 1);
        matchLog(str, banksiaVerbose);
    }
    
    std::sort(playerVec.begin(), playerVec.end(), [](const TourPlayer& lhs, const TourPlayer& rhs)
              {
                  return lhs.getScore() > rhs.getScore();
              });
    
    std::set<std::string> pairedSet;
    for(auto && m : matchRecordList) {
        if (m.playernames[0].empty() || m.playernames[1].empty()) continue;
        pairedSet.insert(m.playernames[0] + "*" + m.playernames[1]);
    }
    
    if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
        std::cout << "Warning: All players have played together already." << std::endl;
        pairedSet.clear();
        if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
            std::cerr << "Error: cannot pair players." << std::endl;
            return false;
        }
    }
    
    std::string str = "\n" + std::string(tourTypeNames[static_cast<int>(type)]) + " round: " + std::to_string(round + 1);
    if (type == TourType::swiss) {
        str += "/" + std::to_string(swissRounds);
    }
    str += ", pairs: " + std::to_string(playerVec.size() / 2) + ", matches: " + std::to_string(uncompletedMatches());
    
    matchLog(str, true);
    return true;
}